

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jccolor.c
# Opt level: O0

void rgb_ycc_convert(j_compress_ptr cinfo,JSAMPARRAY input_buf,JSAMPIMAGE output_buf,
                    JDIMENSION output_row,int num_rows)

{
  uint uVar1;
  _func_void_j_compress_ptr *p_Var2;
  JSAMPROW pJVar3;
  JSAMPROW pJVar4;
  JSAMPROW pJVar5;
  uint uVar6;
  uint uVar7;
  uint uVar8;
  JSAMPARRAY ppJVar9;
  JDIMENSION num_cols_1;
  JDIMENSION col_1;
  JSAMPROW outptr2_1;
  JSAMPROW outptr1_1;
  JSAMPROW outptr0_1;
  JSAMPROW inptr_1;
  JLONG *ctab_1;
  int b_1;
  int g_1;
  int r_1;
  my_cconvert_ptr cconvert_1;
  JDIMENSION num_cols_2;
  JDIMENSION col_2;
  JSAMPROW outptr2_2;
  JSAMPROW outptr1_2;
  JSAMPROW outptr0_2;
  JSAMPROW inptr_2;
  JLONG *ctab_2;
  int b_2;
  int g_2;
  int r_2;
  my_cconvert_ptr cconvert_2;
  JDIMENSION num_cols_3;
  JDIMENSION col_3;
  JSAMPROW outptr2_3;
  JSAMPROW outptr1_3;
  JSAMPROW outptr0_3;
  JSAMPROW inptr_3;
  JLONG *ctab_3;
  int b_3;
  int g_3;
  int r_3;
  my_cconvert_ptr cconvert_3;
  JDIMENSION num_cols_4;
  JDIMENSION col_4;
  JSAMPROW outptr2_4;
  JSAMPROW outptr1_4;
  JSAMPROW outptr0_4;
  JSAMPROW inptr_4;
  JLONG *ctab_4;
  int b_4;
  int g_4;
  int r_4;
  my_cconvert_ptr cconvert_4;
  JDIMENSION num_cols_5;
  JDIMENSION col_5;
  JSAMPROW outptr2_5;
  JSAMPROW outptr1_5;
  JSAMPROW outptr0_5;
  JSAMPROW inptr_5;
  JLONG *ctab_5;
  int b_5;
  int g_5;
  int r_5;
  my_cconvert_ptr cconvert_5;
  JDIMENSION num_cols_6;
  JDIMENSION col_6;
  JSAMPROW outptr2_6;
  JSAMPROW outptr1_6;
  JSAMPROW outptr0_6;
  JSAMPROW inptr_6;
  JLONG *ctab_6;
  int b_6;
  int g_6;
  int r_6;
  my_cconvert_ptr cconvert_6;
  uint local_2d4;
  byte *local_2b8;
  int local_290;
  uint local_28c;
  JSAMPARRAY local_280;
  uint local_26c;
  byte *local_250;
  int local_228;
  uint local_224;
  JSAMPARRAY local_218;
  uint local_204;
  byte *local_1e8;
  int local_1c0;
  uint local_1bc;
  JSAMPARRAY local_1b0;
  uint local_19c;
  byte *local_180;
  int local_158;
  uint local_154;
  JSAMPARRAY local_148;
  uint local_134;
  JSAMPROW local_118;
  int local_f0;
  uint local_ec;
  JSAMPARRAY local_e0;
  uint local_cc;
  JSAMPROW local_b0;
  int local_88;
  uint local_84;
  int num_rows_local;
  JDIMENSION output_row_local;
  JSAMPIMAGE output_buf_local;
  JSAMPARRAY input_buf_local;
  j_compress_ptr cinfo_local;
  JDIMENSION num_cols;
  JDIMENSION col;
  JSAMPROW outptr2;
  JSAMPROW outptr1;
  JSAMPROW outptr0;
  JSAMPROW inptr;
  JLONG *ctab;
  int b;
  int g;
  int r;
  my_cconvert_ptr cconvert;
  JSAMPARRAY local_10;
  
  switch(cinfo->in_color_space) {
  case JCS_EXT_RGB:
    p_Var2 = cinfo->cconvert[1].start_pass;
    uVar1 = cinfo->image_width;
    local_290 = num_rows;
    local_28c = output_row;
    local_280 = input_buf;
    while (local_290 = local_290 + -1, -1 < local_290) {
      ppJVar9 = local_280 + 1;
      local_2b8 = *local_280;
      pJVar3 = (*output_buf)[local_28c];
      pJVar4 = output_buf[1][local_28c];
      pJVar5 = output_buf[2][local_28c];
      local_28c = local_28c + 1;
      for (local_2d4 = 0; local_280 = ppJVar9, local_2d4 < uVar1; local_2d4 = local_2d4 + 1) {
        uVar6 = (uint)*local_2b8;
        uVar7 = (uint)local_2b8[1];
        uVar8 = (uint)local_2b8[2];
        local_2b8 = local_2b8 + 3;
        pJVar3[local_2d4] =
             (JSAMPLE)((ulong)(*(long *)(p_Var2 + (long)(int)uVar6 * 8) +
                               *(long *)(p_Var2 + (long)(int)(uVar7 + 0x100) * 8) +
                              *(long *)(p_Var2 + (long)(int)(uVar8 + 0x200) * 8)) >> 0x10);
        pJVar4[local_2d4] =
             (JSAMPLE)((ulong)(*(long *)(p_Var2 + (long)(int)(uVar6 + 0x300) * 8) +
                               *(long *)(p_Var2 + (long)(int)(uVar7 + 0x400) * 8) +
                              *(long *)(p_Var2 + (long)(int)(uVar8 + 0x500) * 8)) >> 0x10);
        pJVar5[local_2d4] =
             (JSAMPLE)((ulong)(*(long *)(p_Var2 + (long)(int)(uVar6 + 0x500) * 8) +
                               *(long *)(p_Var2 + (long)(int)(uVar7 + 0x600) * 8) +
                              *(long *)(p_Var2 + (long)(int)(uVar8 + 0x700) * 8)) >> 0x10);
      }
    }
    break;
  case JCS_EXT_RGBX:
  case JCS_EXT_RGBA:
    p_Var2 = cinfo->cconvert[1].start_pass;
    uVar1 = cinfo->image_width;
    local_228 = num_rows;
    local_224 = output_row;
    local_218 = input_buf;
    while (local_228 = local_228 + -1, -1 < local_228) {
      ppJVar9 = local_218 + 1;
      local_250 = *local_218;
      pJVar3 = (*output_buf)[local_224];
      pJVar4 = output_buf[1][local_224];
      pJVar5 = output_buf[2][local_224];
      local_224 = local_224 + 1;
      for (local_26c = 0; local_218 = ppJVar9, local_26c < uVar1; local_26c = local_26c + 1) {
        uVar6 = (uint)*local_250;
        uVar7 = (uint)local_250[1];
        uVar8 = (uint)local_250[2];
        local_250 = local_250 + 4;
        pJVar3[local_26c] =
             (JSAMPLE)((ulong)(*(long *)(p_Var2 + (long)(int)uVar6 * 8) +
                               *(long *)(p_Var2 + (long)(int)(uVar7 + 0x100) * 8) +
                              *(long *)(p_Var2 + (long)(int)(uVar8 + 0x200) * 8)) >> 0x10);
        pJVar4[local_26c] =
             (JSAMPLE)((ulong)(*(long *)(p_Var2 + (long)(int)(uVar6 + 0x300) * 8) +
                               *(long *)(p_Var2 + (long)(int)(uVar7 + 0x400) * 8) +
                              *(long *)(p_Var2 + (long)(int)(uVar8 + 0x500) * 8)) >> 0x10);
        pJVar5[local_26c] =
             (JSAMPLE)((ulong)(*(long *)(p_Var2 + (long)(int)(uVar6 + 0x500) * 8) +
                               *(long *)(p_Var2 + (long)(int)(uVar7 + 0x600) * 8) +
                              *(long *)(p_Var2 + (long)(int)(uVar8 + 0x700) * 8)) >> 0x10);
      }
    }
    break;
  case JCS_EXT_BGR:
    p_Var2 = cinfo->cconvert[1].start_pass;
    uVar1 = cinfo->image_width;
    local_1c0 = num_rows;
    local_1bc = output_row;
    local_1b0 = input_buf;
    while (local_1c0 = local_1c0 + -1, -1 < local_1c0) {
      ppJVar9 = local_1b0 + 1;
      local_1e8 = *local_1b0;
      pJVar3 = (*output_buf)[local_1bc];
      pJVar4 = output_buf[1][local_1bc];
      pJVar5 = output_buf[2][local_1bc];
      local_1bc = local_1bc + 1;
      for (local_204 = 0; local_1b0 = ppJVar9, local_204 < uVar1; local_204 = local_204 + 1) {
        uVar6 = (uint)local_1e8[2];
        uVar7 = (uint)local_1e8[1];
        uVar8 = (uint)*local_1e8;
        local_1e8 = local_1e8 + 3;
        pJVar3[local_204] =
             (JSAMPLE)((ulong)(*(long *)(p_Var2 + (long)(int)uVar6 * 8) +
                               *(long *)(p_Var2 + (long)(int)(uVar7 + 0x100) * 8) +
                              *(long *)(p_Var2 + (long)(int)(uVar8 + 0x200) * 8)) >> 0x10);
        pJVar4[local_204] =
             (JSAMPLE)((ulong)(*(long *)(p_Var2 + (long)(int)(uVar6 + 0x300) * 8) +
                               *(long *)(p_Var2 + (long)(int)(uVar7 + 0x400) * 8) +
                              *(long *)(p_Var2 + (long)(int)(uVar8 + 0x500) * 8)) >> 0x10);
        pJVar5[local_204] =
             (JSAMPLE)((ulong)(*(long *)(p_Var2 + (long)(int)(uVar6 + 0x500) * 8) +
                               *(long *)(p_Var2 + (long)(int)(uVar7 + 0x600) * 8) +
                              *(long *)(p_Var2 + (long)(int)(uVar8 + 0x700) * 8)) >> 0x10);
      }
    }
    break;
  case JCS_EXT_BGRX:
  case JCS_EXT_BGRA:
    p_Var2 = cinfo->cconvert[1].start_pass;
    uVar1 = cinfo->image_width;
    local_158 = num_rows;
    local_154 = output_row;
    local_148 = input_buf;
    while (local_158 = local_158 + -1, -1 < local_158) {
      ppJVar9 = local_148 + 1;
      local_180 = *local_148;
      pJVar3 = (*output_buf)[local_154];
      pJVar4 = output_buf[1][local_154];
      pJVar5 = output_buf[2][local_154];
      local_154 = local_154 + 1;
      for (local_19c = 0; local_148 = ppJVar9, local_19c < uVar1; local_19c = local_19c + 1) {
        uVar6 = (uint)local_180[2];
        uVar7 = (uint)local_180[1];
        uVar8 = (uint)*local_180;
        local_180 = local_180 + 4;
        pJVar3[local_19c] =
             (JSAMPLE)((ulong)(*(long *)(p_Var2 + (long)(int)uVar6 * 8) +
                               *(long *)(p_Var2 + (long)(int)(uVar7 + 0x100) * 8) +
                              *(long *)(p_Var2 + (long)(int)(uVar8 + 0x200) * 8)) >> 0x10);
        pJVar4[local_19c] =
             (JSAMPLE)((ulong)(*(long *)(p_Var2 + (long)(int)(uVar6 + 0x300) * 8) +
                               *(long *)(p_Var2 + (long)(int)(uVar7 + 0x400) * 8) +
                              *(long *)(p_Var2 + (long)(int)(uVar8 + 0x500) * 8)) >> 0x10);
        pJVar5[local_19c] =
             (JSAMPLE)((ulong)(*(long *)(p_Var2 + (long)(int)(uVar6 + 0x500) * 8) +
                               *(long *)(p_Var2 + (long)(int)(uVar7 + 0x600) * 8) +
                              *(long *)(p_Var2 + (long)(int)(uVar8 + 0x700) * 8)) >> 0x10);
      }
    }
    break;
  case JCS_EXT_XBGR:
  case JCS_EXT_ABGR:
    p_Var2 = cinfo->cconvert[1].start_pass;
    uVar1 = cinfo->image_width;
    local_f0 = num_rows;
    local_ec = output_row;
    local_e0 = input_buf;
    while (local_f0 = local_f0 + -1, -1 < local_f0) {
      ppJVar9 = local_e0 + 1;
      local_118 = *local_e0;
      pJVar3 = (*output_buf)[local_ec];
      pJVar4 = output_buf[1][local_ec];
      pJVar5 = output_buf[2][local_ec];
      local_ec = local_ec + 1;
      for (local_134 = 0; local_e0 = ppJVar9, local_134 < uVar1; local_134 = local_134 + 1) {
        uVar6 = (uint)local_118[3];
        uVar7 = (uint)local_118[2];
        uVar8 = (uint)local_118[1];
        local_118 = local_118 + 4;
        pJVar3[local_134] =
             (JSAMPLE)((ulong)(*(long *)(p_Var2 + (long)(int)uVar6 * 8) +
                               *(long *)(p_Var2 + (long)(int)(uVar7 + 0x100) * 8) +
                              *(long *)(p_Var2 + (long)(int)(uVar8 + 0x200) * 8)) >> 0x10);
        pJVar4[local_134] =
             (JSAMPLE)((ulong)(*(long *)(p_Var2 + (long)(int)(uVar6 + 0x300) * 8) +
                               *(long *)(p_Var2 + (long)(int)(uVar7 + 0x400) * 8) +
                              *(long *)(p_Var2 + (long)(int)(uVar8 + 0x500) * 8)) >> 0x10);
        pJVar5[local_134] =
             (JSAMPLE)((ulong)(*(long *)(p_Var2 + (long)(int)(uVar6 + 0x500) * 8) +
                               *(long *)(p_Var2 + (long)(int)(uVar7 + 0x600) * 8) +
                              *(long *)(p_Var2 + (long)(int)(uVar8 + 0x700) * 8)) >> 0x10);
      }
    }
    break;
  case JCS_EXT_XRGB:
  case JCS_EXT_ARGB:
    p_Var2 = cinfo->cconvert[1].start_pass;
    uVar1 = cinfo->image_width;
    local_88 = num_rows;
    local_84 = output_row;
    _num_rows_local = input_buf;
    while (local_88 = local_88 + -1, -1 < local_88) {
      ppJVar9 = _num_rows_local + 1;
      local_b0 = *_num_rows_local;
      pJVar3 = (*output_buf)[local_84];
      pJVar4 = output_buf[1][local_84];
      pJVar5 = output_buf[2][local_84];
      local_84 = local_84 + 1;
      for (local_cc = 0; _num_rows_local = ppJVar9, local_cc < uVar1; local_cc = local_cc + 1) {
        uVar6 = (uint)local_b0[1];
        uVar7 = (uint)local_b0[2];
        uVar8 = (uint)local_b0[3];
        local_b0 = local_b0 + 4;
        pJVar3[local_cc] =
             (JSAMPLE)((ulong)(*(long *)(p_Var2 + (long)(int)uVar6 * 8) +
                               *(long *)(p_Var2 + (long)(int)(uVar7 + 0x100) * 8) +
                              *(long *)(p_Var2 + (long)(int)(uVar8 + 0x200) * 8)) >> 0x10);
        pJVar4[local_cc] =
             (JSAMPLE)((ulong)(*(long *)(p_Var2 + (long)(int)(uVar6 + 0x300) * 8) +
                               *(long *)(p_Var2 + (long)(int)(uVar7 + 0x400) * 8) +
                              *(long *)(p_Var2 + (long)(int)(uVar8 + 0x500) * 8)) >> 0x10);
        pJVar5[local_cc] =
             (JSAMPLE)((ulong)(*(long *)(p_Var2 + (long)(int)(uVar6 + 0x500) * 8) +
                               *(long *)(p_Var2 + (long)(int)(uVar7 + 0x600) * 8) +
                              *(long *)(p_Var2 + (long)(int)(uVar8 + 0x700) * 8)) >> 0x10);
      }
    }
    break;
  default:
    p_Var2 = cinfo->cconvert[1].start_pass;
    uVar1 = cinfo->image_width;
    g = num_rows;
    r = output_row;
    local_10 = input_buf;
    while (g = g + -1, -1 < g) {
      ppJVar9 = local_10 + 1;
      outptr1 = *local_10;
      pJVar3 = (*output_buf)[(uint)r];
      pJVar4 = output_buf[1][(uint)r];
      pJVar5 = output_buf[2][(uint)r];
      r = r + 1;
      for (input_buf_local._4_4_ = 0; local_10 = ppJVar9, input_buf_local._4_4_ < uVar1;
          input_buf_local._4_4_ = input_buf_local._4_4_ + 1) {
        uVar6 = (uint)*outptr1;
        uVar7 = (uint)outptr1[1];
        uVar8 = (uint)outptr1[2];
        outptr1 = outptr1 + 3;
        pJVar3[input_buf_local._4_4_] =
             (JSAMPLE)((ulong)(*(long *)(p_Var2 + (long)(int)uVar6 * 8) +
                               *(long *)(p_Var2 + (long)(int)(uVar7 + 0x100) * 8) +
                              *(long *)(p_Var2 + (long)(int)(uVar8 + 0x200) * 8)) >> 0x10);
        pJVar4[input_buf_local._4_4_] =
             (JSAMPLE)((ulong)(*(long *)(p_Var2 + (long)(int)(uVar6 + 0x300) * 8) +
                               *(long *)(p_Var2 + (long)(int)(uVar7 + 0x400) * 8) +
                              *(long *)(p_Var2 + (long)(int)(uVar8 + 0x500) * 8)) >> 0x10);
        pJVar5[input_buf_local._4_4_] =
             (JSAMPLE)((ulong)(*(long *)(p_Var2 + (long)(int)(uVar6 + 0x500) * 8) +
                               *(long *)(p_Var2 + (long)(int)(uVar7 + 0x600) * 8) +
                              *(long *)(p_Var2 + (long)(int)(uVar8 + 0x700) * 8)) >> 0x10);
      }
    }
  }
  return;
}

Assistant:

METHODDEF(void)
rgb_ycc_convert(j_compress_ptr cinfo, JSAMPARRAY input_buf,
                JSAMPIMAGE output_buf, JDIMENSION output_row, int num_rows)
{
  switch (cinfo->in_color_space) {
  case JCS_EXT_RGB:
    extrgb_ycc_convert_internal(cinfo, input_buf, output_buf, output_row,
                                num_rows);
    break;
  case JCS_EXT_RGBX:
  case JCS_EXT_RGBA:
    extrgbx_ycc_convert_internal(cinfo, input_buf, output_buf, output_row,
                                 num_rows);
    break;
  case JCS_EXT_BGR:
    extbgr_ycc_convert_internal(cinfo, input_buf, output_buf, output_row,
                                num_rows);
    break;
  case JCS_EXT_BGRX:
  case JCS_EXT_BGRA:
    extbgrx_ycc_convert_internal(cinfo, input_buf, output_buf, output_row,
                                 num_rows);
    break;
  case JCS_EXT_XBGR:
  case JCS_EXT_ABGR:
    extxbgr_ycc_convert_internal(cinfo, input_buf, output_buf, output_row,
                                 num_rows);
    break;
  case JCS_EXT_XRGB:
  case JCS_EXT_ARGB:
    extxrgb_ycc_convert_internal(cinfo, input_buf, output_buf, output_row,
                                 num_rows);
    break;
  default:
    rgb_ycc_convert_internal(cinfo, input_buf, output_buf, output_row,
                             num_rows);
    break;
  }
}